

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# late_materialization.cpp
# Opt level: O3

idx_t __thiscall
duckdb::LateMaterialization::GetOrInsertRowId(LateMaterialization *this,LogicalGet *get)

{
  iterator __position;
  vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *this_00;
  reference pvVar1;
  size_type __n;
  ColumnIndex local_40;
  
  this_00 = &LogicalGet::GetMutableColumnIds(get)->
             super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>;
  if ((this_00->super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
      _M_impl.super__Vector_impl_data._M_finish !=
      (this_00->super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
      _M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar1 = vector<duckdb::ColumnIndex,_true>::operator[]
                         ((vector<duckdb::ColumnIndex,_true> *)this_00,__n);
      if (pvVar1->index == 0xffffffffffffffff) {
        return __n;
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(this_00->
                                 super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_00->
                                 super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                 )._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  local_40.index = 0xffffffffffffffff;
  local_40.child_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
  super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_40.child_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
  super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40.child_indexes.super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
  super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::
  emplace_back<duckdb::ColumnIndex>(this_00,&local_40);
  ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
            (&local_40.child_indexes.
              super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
  __position._M_current =
       (get->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((get->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != __position._M_current) {
    local_40.index =
         ((long)(this_00->
                super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this_00->
                super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
                _M_impl.super__Vector_impl_data._M_start >> 5) - 1;
    if (__position._M_current ==
        (get->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (&(get->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
                 __position,&local_40.index);
    }
    else {
      *__position._M_current = local_40.index;
      (get->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  if ((get->super_LogicalOperator).types.
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (get->super_LogicalOperator).types.
      super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
               &(get->super_LogicalOperator).types,&this->row_id_type);
  }
  return ((long)(this_00->
                super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this_00->
                super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
                _M_impl.super__Vector_impl_data._M_start >> 5) - 1;
}

Assistant:

idx_t LateMaterialization::GetOrInsertRowId(LogicalGet &get) {
	auto &column_ids = get.GetMutableColumnIds();
	// check if it is already projected
	for (idx_t i = 0; i < column_ids.size(); ++i) {
		if (column_ids[i].IsRowIdColumn()) {
			// already projected - return the id
			return i;
		}
	}
	// row id is not yet projected - push it and return the new index
	column_ids.push_back(ColumnIndex(COLUMN_IDENTIFIER_ROW_ID));
	if (!get.projection_ids.empty()) {
		get.projection_ids.push_back(column_ids.size() - 1);
	}
	if (!get.types.empty()) {
		get.types.push_back(row_id_type);
	}
	return column_ids.size() - 1;
}